

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void __thiscall
cimg_library::CImg<float>::CImg<unsigned_char>(CImg<float> *this,CImg<unsigned_char> *img)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  float *pfVar5;
  float *pfVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  
  this->_is_shared = false;
  puVar4 = img->_data;
  if (puVar4 != (uchar *)0x0) {
    uVar1 = img->_height;
    uVar2 = img->_depth;
    uVar3 = img->_spectrum;
    uVar8 = uVar2 * uVar3 * uVar1 * img->_width;
    if (uVar8 != 0) {
      this->_width = img->_width;
      this->_height = uVar1;
      this->_depth = uVar2;
      this->_spectrum = uVar3;
      uVar9 = (ulong)uVar8;
      pfVar5 = (float *)operator_new__(uVar9 * 4);
      this->_data = pfVar5;
      pbVar7 = puVar4 + uVar9;
      for (pfVar6 = pfVar5 + uVar9; pbVar7 = pbVar7 + -1, pfVar5 < pfVar6; pfVar6 = pfVar6 + -1) {
        pfVar6[-1] = (float)*pbVar7;
      }
      return;
    }
  }
  this->_data = (float *)0x0;
  this->_width = 0;
  this->_height = 0;
  this->_depth = 0;
  this->_spectrum = 0;
  return;
}

Assistant:

CImg(const CImg<t>& img):_is_shared(false) {
      const unsigned int siz = img.size();
      if (img._data && siz) {
        _width = img._width; _height = img._height; _depth = img._depth; _spectrum = img._spectrum;
        try { _data = new T[siz]; } catch (...) {
          _width = _height = _depth = _spectrum = 0; _data = 0;
          throw CImgInstanceException(_cimg_instance
                                      "CImg() : Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      cimg::strbuffersize(img._width*img._height*img._depth*img._spectrum*sizeof(T)),
                                      img._width,img._height,img._depth,img._spectrum);
        }
        const t *ptrs = img._data + siz; cimg_for(*this,ptrd,T) *ptrd = (T)*(--ptrs);
      } else { _width = _height = _depth = _spectrum = 0; _data = 0; }
    }